

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossfactorstocsv.cpp
# Opt level: O3

void lossfactorstocsv::DoIt(void)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  event_count ec;
  amplification_factor af;
  uint local_40;
  int local_3c;
  uint local_38;
  float local_34;
  
  local_40 = 0;
  fread(&local_40,4,1,_stdin);
  fwrite("event_id,amplification_id,factor\n",0x21,1,_stdout);
  sVar4 = fread(&local_40,8,1,_stdin);
  if (sVar4 != 0) {
    uVar1 = local_40;
    iVar2 = local_3c;
    do {
      for (; uVar3 = local_40, local_40 = uVar1, iVar2 != 0; iVar2 = iVar2 + -1) {
        sVar4 = fread(&local_38,8,1,_stdin);
        if (sVar4 == 0) {
          DoIt((lossfactorstocsv *)(ulong)uVar3);
        }
        fprintf(_stdout,"%d,%d,%f\n",(double)local_34,(ulong)uVar3,(ulong)local_38);
        uVar1 = local_40;
        local_40 = uVar3;
      }
      sVar4 = fread(&local_40,8,1,_stdin);
      uVar1 = local_40;
      iVar2 = local_3c;
    } while (sVar4 != 0);
  }
  return;
}

Assistant:

void DoIt() {

    size_t i = ReadOpts();

    event_count ec;
    amplification_factor af;

    fprintf(stdout, "event_id,amplification_id,factor\n");   // Header

    while (i = fread(&ec, sizeof(ec), 1, stdin) != 0) {

      for (int counter = 0; counter != ec.count; ++counter) {

        i = fread(&af, sizeof(af), 1, stdin);
	if (i == 0) {
	  fprintf(stderr, "FATAL: Incomplete data for Event ID = %d\n",
		  ec.event_id);
	  exit(EXIT_FAILURE);
	}

	fprintf(stdout, "%d,%d,%f\n", ec.event_id, af.amplification_id,
		af.factor);

      }

    }

  }